

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer2.c
# Opt level: O3

ktx_error_code_e ktxTexture2_WriteToStdioStream(ktxTexture2 *This,FILE *dstsstr)

{
  ktx_error_code_e kVar1;
  ktxStream stream;
  ktxStream local_70;
  
  if (This != (ktxTexture2 *)0x0) {
    kVar1 = ktxFileStream_construct(&local_70,dstsstr,false);
    if (kVar1 == KTX_SUCCESS) {
      kVar1 = ktxTexture2_WriteToStream(This,&local_70);
    }
    return kVar1;
  }
  return KTX_INVALID_VALUE;
}

Assistant:

KTX_error_code
ktxTexture2_WriteToStdioStream(ktxTexture2* This, FILE* dstsstr)
{
    ktxStream stream;
    KTX_error_code result = KTX_SUCCESS;

    if (!This)
        return KTX_INVALID_VALUE;

    result = ktxFileStream_construct(&stream, dstsstr, KTX_FALSE);
    if (result != KTX_SUCCESS)
        return result;

    return ktxTexture2_WriteToStream(This, &stream);
}